

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynUnaryOpType GetUnaryOpType(LexemeType type)

{
  SynUnaryOpType local_c;
  LexemeType type_local;
  
  switch(type) {
  case lex_add:
    local_c = SYN_UNARY_OP_PLUS;
    break;
  case lex_sub:
    local_c = SYN_UNARY_OP_NEGATE;
    break;
  default:
    local_c = SYN_UNARY_OP_UNKNOWN;
    break;
  case lex_bitnot:
    local_c = SYN_UNARY_OP_BIT_NOT;
    break;
  case lex_lognot:
    local_c = SYN_UNARY_OP_LOGICAL_NOT;
  }
  return local_c;
}

Assistant:

SynUnaryOpType GetUnaryOpType(LexemeType type)
{
	switch(type)
	{
	case lex_add:
		return SYN_UNARY_OP_PLUS;
	case lex_sub:
		return SYN_UNARY_OP_NEGATE;
	case lex_bitnot:
		return SYN_UNARY_OP_BIT_NOT;
	case lex_lognot:
		return SYN_UNARY_OP_LOGICAL_NOT;
	default:
		break;
	}

	return SYN_UNARY_OP_UNKNOWN;
}